

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
uttt::IBoard::GetPossibleMoves
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,IBoard *this)

{
  short sVar1;
  char *pcVar2;
  iterator iVar3;
  long lVar4;
  long lVar5;
  int i;
  char *pcVar6;
  int local_40;
  int local_3c;
  IBoard *local_38;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((long)this->next < 0) {
    lVar4 = 0;
    local_38 = this;
    do {
      sVar1 = (local_38->micro)._M_elems[lVar4];
      pcVar6 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar6 != pcVar2) {
        do {
          lVar5 = (long)*pcVar6 + (long)((int)lVar4 * 9);
          local_40 = (int)lVar5;
          iVar3._M_current =
               (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar3,&local_40);
          }
          else {
            *iVar3._M_current = lVar5;
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 9);
  }
  else {
    sVar1 = (this->micro)._M_elems[this->next];
    pcVar6 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar6 != pcVar2) {
      do {
        lVar4 = (long)this->next * 9 + (long)*pcVar6;
        local_3c = (int)lVar4;
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,iVar3,&local_3c);
        }
        else {
          *iVar3._M_current = lVar4;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<game::IMove>
IBoard::GetPossibleMoves() const
{
    std::vector<game::IMove> moves;
    if (next >= 0)
        for (auto m : g_moves[micro[next]])
            moves.emplace_back(next * 9 + m);
    else
        for (int i = 0; i < 9; i++)
            for (auto m : g_moves[micro[i]])
                moves.emplace_back(i * 9 + m);
    return moves;
}